

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O3

size_t ares_buf_consume_charset(ares_buf_t *buf,uchar *charset,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  size_t j;
  size_t sVar4;
  bool bVar5;
  
  if ((buf != (ares_buf_t *)0x0) && (buf->data != (uchar *)0x0)) {
    sVar1 = buf->offset;
    uVar3 = buf->data_len - sVar1;
    if ((uVar3 != 0) && (len != 0 && charset != (uchar *)0x0)) {
      uVar2 = 0;
      while( true ) {
        sVar4 = 0;
        while (buf->data[uVar2 + sVar1] != charset[sVar4]) {
          sVar4 = sVar4 + 1;
          if (len == sVar4) goto LAB_0012556f;
        }
        if (len == sVar4) break;
        uVar2 = uVar2 + 1;
        if (uVar2 == uVar3) {
LAB_00125579:
          buf->offset = sVar1 + uVar3;
          return uVar3;
        }
      }
LAB_0012556f:
      if (uVar2 == 0) {
        return 0;
      }
      bVar5 = uVar3 < uVar2;
      uVar3 = uVar2;
      if (bVar5) {
        return uVar2;
      }
      goto LAB_00125579;
    }
  }
  return 0;
}

Assistant:

size_t ares_buf_consume_charset(ares_buf_t *buf, const unsigned char *charset,
                                size_t len)
{
  size_t               remaining_len = 0;
  const unsigned char *ptr           = ares_buf_fetch(buf, &remaining_len);
  size_t               i;

  if (ptr == NULL || charset == NULL || len == 0) {
    return 0;
  }

  for (i = 0; i < remaining_len; i++) {
    size_t j;
    for (j = 0; j < len; j++) {
      if (ptr[i] == charset[j]) {
        break;
      }
    }
    /* Not found */
    if (j == len) {
      break;
    }
  }

  if (i > 0) {
    ares_buf_consume(buf, i);
  }
  return i;
}